

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::FindPrevUserEntry(DBIter *this)

{
  Comparator *pCVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  size_t sVar6;
  undefined4 extraout_var_00;
  char *pcVar7;
  Slice local_98;
  Slice local_88;
  string local_78 [8];
  string empty;
  undefined1 local_58 [8];
  Slice raw_value;
  undefined1 local_38 [8];
  ParsedInternalKey ikey;
  ValueType value_type;
  DBIter *this_local;
  
  if (this->direction_ != kReverse) {
    __assert_fail("direction_ == kReverse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_iter.cc"
                  ,0xf5,"void leveldb::(anonymous namespace)::DBIter::FindPrevUserEntry()");
  }
  ikey._28_4_ = 0;
  uVar3 = (*this->iter_->_vptr_Iterator[2])();
  while ((uVar3 & 1) != 0) {
    ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)local_38);
    bVar2 = ParseKey(this,(ParsedInternalKey *)local_38);
    if ((bVar2) && (ikey.user_key.size_ <= this->sequence_)) {
      bVar2 = false;
      if (ikey._28_4_ != 0) {
        pCVar1 = this->user_comparator_;
        Slice::Slice((Slice *)&raw_value.size_,&this->saved_key_);
        iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,local_38,&raw_value.size_);
        bVar2 = iVar4 < 0;
      }
      if (bVar2) break;
      ikey._28_4_ = (int)ikey.sequence;
      if ((int)ikey.sequence == 0) {
        std::__cxx11::string::clear();
        ClearSavedValue(this);
      }
      else {
        iVar4 = (*this->iter_->_vptr_Iterator[9])();
        local_58 = (undefined1  [8])CONCAT44(extraout_var,iVar4);
        uVar5 = std::__cxx11::string::capacity();
        sVar6 = Slice::size((Slice *)local_58);
        if (sVar6 + 0x100000 < uVar5) {
          std::__cxx11::string::string(local_78);
          std::swap<char,std::char_traits<char>,std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &this->saved_value_);
          std::__cxx11::string::~string(local_78);
        }
        iVar4 = (*this->iter_->_vptr_Iterator[8])();
        local_98.data_ = (char *)CONCAT44(extraout_var_00,iVar4);
        local_88 = ExtractUserKey(&local_98);
        SaveKey(this,&local_88,&this->saved_key_);
        pcVar7 = Slice::data((Slice *)local_58);
        Slice::size((Slice *)local_58);
        std::__cxx11::string::assign((char *)&this->saved_value_,(ulong)pcVar7);
      }
    }
    (*this->iter_->_vptr_Iterator[7])();
    uVar3 = (*this->iter_->_vptr_Iterator[2])();
  }
  if (ikey._28_4_ == 0) {
    this->valid_ = false;
    std::__cxx11::string::clear();
    ClearSavedValue(this);
    this->direction_ = kForward;
  }
  else {
    this->valid_ = true;
  }
  return;
}

Assistant:

void DBIter::FindPrevUserEntry() {
            assert(direction_ == kReverse);

            ValueType value_type = kTypeDeletion;
            if (iter_->Valid()) {
                do {
                    ParsedInternalKey ikey;
                    if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
                        if ((value_type != kTypeDeletion) &&
                            user_comparator_->Compare(ikey.user_key, saved_key_) < 0) {
                            // We encountered a non-deleted value in entries for previous keys,
                            break;
                        }
                        value_type = ikey.type;
                        if (value_type == kTypeDeletion) {
                            saved_key_.clear();
                            ClearSavedValue();
                        } else {
                            Slice raw_value = iter_->value();
                            if (saved_value_.capacity() > raw_value.size() + 1048576) {
                                std::string empty;
                                swap(empty, saved_value_);
                            }
                            SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
                            saved_value_.assign(raw_value.data(), raw_value.size());
                        }
                    }
                    iter_->Prev();
                } while (iter_->Valid());
            }

            if (value_type == kTypeDeletion) {
                // End
                valid_ = false;
                saved_key_.clear();
                ClearSavedValue();
                direction_ = kForward;
            } else {
                valid_ = true;
            }
        }